

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9CompileJsonArray(jx9_gen_state *pGen,sxi32 iCompileFlag)

{
  SyToken *pIn;
  sxi32 sVar1;
  bool bVar2;
  sxi32 rc;
  SyToken *pCur;
  sxi32 nPair;
  sxi32 iCompileFlag_local;
  jx9_gen_state *pGen_local;
  
  pCur._0_4_ = 0;
  pGen->pIn = pGen->pIn + 1;
  pGen->pEnd = pGen->pEnd + -1;
  while( true ) {
    while( true ) {
      bVar2 = false;
      if (pGen->pIn < pGen->pEnd) {
        bVar2 = (pGen->pIn->nType & 0x20000) != 0;
      }
      if (!bVar2) break;
      pGen->pIn = pGen->pIn + 1;
    }
    pIn = pGen->pIn;
    sVar1 = jx9GetNextExpr(pGen->pIn,pGen->pEnd,&pGen->pIn);
    if (sVar1 != 0) break;
    sVar1 = GenStateCompileJSONEntry
                      (pGen,pIn,pGen->pIn,2,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
    if (sVar1 == -10) {
      return -10;
    }
    pCur._0_4_ = (int)pCur + 1;
  }
  jx9VmEmitInstr(pGen->pVm,6,(int)pCur,0,(void *)0x0,(sxu32 *)0x0);
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9CompileJsonArray(jx9_gen_state *pGen, sxi32 iCompileFlag)
{
	sxi32 nPair = 0;
	SyToken *pCur;
	sxi32 rc;

	pGen->pIn++; /* Jump the open square bracket '['*/
	pGen->pEnd--;
	SXUNUSED(iCompileFlag); /* cc warning */
	for(;;){
		/* Jump leading commas */
		while( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_COMMA) ){
			pGen->pIn++;
		}
		pCur = pGen->pIn;
		if( SXRET_OK != jx9GetNextExpr(pGen->pIn, pGen->pEnd, &pGen->pIn) ){
			/* No more entry to process */
			break;
		}
		/* Compile entry */
		rc = GenStateCompileJSONEntry(&(*pGen),pCur,pGen->pIn,EXPR_FLAG_RDONLY_LOAD/*Do not create the variable if inexistant*/,0);
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}
		nPair++;
	}
	/* Emit the load map instruction */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_LOAD_MAP,nPair,0,0,0);
	/* Node successfully compiled */
	return SXRET_OK;
}